

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallclocktimer.cpp
# Opt level: O2

time_t __thiscall soplex::WallclockTimer::time(WallclockTimer *this,time_t *__timer)

{
  time_t in_RAX;
  long lVar1;
  timeval tp;
  timeval local_20;
  
  if ((this->super_Timer).status == RUNNING) {
    gettimeofday(&local_20,(__timezone_ptr_t)0x0);
    in_RAX = this->usec + local_20.tv_usec;
    if (in_RAX < 0xf4241) {
      lVar1 = local_20.tv_sec + this->sec;
    }
    else {
      lVar1 = this->sec + local_20.tv_sec + 1;
      in_RAX = in_RAX + -1000000;
    }
    this->lasttime = (double)in_RAX * 1e-06 + (double)lVar1;
  }
  return in_RAX;
}

Assistant:

Real WallclockTimer::time() const
{
#if !defined(_WIN32) && !defined(_WIN64)
   struct timeval tp; /*lint !e86*/
#endif

   // only update times if timer is still running
   if(status == RUNNING)
   {
#if defined(_WIN32) || defined(_WIN64)
      // we need the blank specifier to distiguish this method from WallclockTimer::time
      lasttime = wall2sec(sec + ::time(nullptr), 0);
#else
      gettimeofday(&tp, nullptr);

      // check whether the microseconds add up to more than a second
      if(tp.tv_usec + usec > 1000000)   /*lint !e115 !e40*/
         lasttime = wall2sec(sec + tp.tv_sec + 1, /*lint !e115 !e40*/
                             (usec - 1000000) + tp.tv_usec); /*lint !e115 !e40*/
      else
         lasttime = wall2sec(sec + tp.tv_sec, /*lint !e115 !e40*/
                             usec + tp.tv_usec); /*lint !e115 !e40*/

#endif
   }

   return lasttime;
}